

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# put.cpp
# Opt level: O2

matrix * __thiscall put::option_Crank_Nicolson(matrix *__return_storage_ptr__,put *this,int m,int n)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_f8;
  matrix A;
  matrix local_80;
  matrix B;
  matrix C;
  
  dVar3 = (this->super_payoff).L_;
  dVar6 = (this->super_payoff).T_;
  iVar2 = m + 1;
  matrix::matrix(&A,iVar2,iVar2);
  matrix::matrix(&B,iVar2,iVar2);
  matrix::matrix(&C,iVar2,iVar2);
  matrix::matrix(__return_storage_ptr__,iVar2,1);
  dVar5 = (this->super_payoff).K_;
  pdVar1 = matrix::operator()(__return_storage_ptr__,0,0);
  *pdVar1 = dVar5;
  dVar5 = (this->super_payoff).r_;
  pdVar1 = matrix::operator()(&A,0,0);
  dVar6 = dVar6 / (double)n;
  *pdVar1 = dVar5 * dVar6 * 0.5 + 1.0;
  dVar5 = (this->super_payoff).r_;
  pdVar1 = matrix::operator()(&B,0,0);
  dVar3 = dVar3 / (double)m;
  dVar7 = dVar6 / dVar3;
  dVar8 = dVar6 / (dVar3 * dVar3);
  *pdVar1 = dVar5 * dVar6 * -0.5 + 1.0;
  for (iVar2 = 1; iVar2 < m; iVar2 = iVar2 + 1) {
    dVar5 = (this->super_payoff).r_;
    dVar9 = (this->super_payoff).sigma_;
    pdVar1 = matrix::operator()(&A,iVar2,iVar2 + -1);
    dVar4 = (double)iVar2 * dVar3;
    dVar9 = dVar9 * dVar4;
    *pdVar1 = dVar5 * 0.25 * dVar4 * dVar7 + dVar9 * dVar9 * -0.25 * dVar8;
    dVar5 = (this->super_payoff).r_;
    dVar9 = (this->super_payoff).sigma_;
    pdVar1 = matrix::operator()(&A,iVar2,iVar2);
    dVar9 = dVar9 * dVar4;
    *pdVar1 = dVar5 * dVar6 * 5.0 + dVar9 * dVar9 * dVar8 * 0.5 + 1.0;
    dVar5 = (this->super_payoff).r_;
    dVar9 = (this->super_payoff).sigma_;
    pdVar1 = matrix::operator()(&A,iVar2,iVar2 + 1);
    dVar9 = dVar9 * dVar4;
    *pdVar1 = dVar5 * -0.25 * dVar4 * dVar7 + dVar9 * dVar9 * -0.25 * dVar8;
    dVar5 = (this->super_payoff).r_;
    dVar9 = (this->super_payoff).sigma_;
    pdVar1 = matrix::operator()(&B,iVar2,iVar2 + -1);
    dVar9 = dVar9 * dVar4;
    *pdVar1 = dVar5 * -0.25 * dVar4 * dVar7 + dVar9 * dVar9 * 0.25 * dVar8;
    dVar5 = (this->super_payoff).r_;
    dVar9 = (this->super_payoff).sigma_;
    pdVar1 = matrix::operator()(&B,iVar2,iVar2);
    dVar9 = dVar9 * dVar4;
    *pdVar1 = dVar5 * dVar6 * -5.0 + dVar9 * dVar9 * dVar8 * -0.5 + 1.0;
    dVar5 = (this->super_payoff).r_;
    dVar9 = (this->super_payoff).sigma_;
    pdVar1 = matrix::operator()(&B,iVar2,iVar2 + 1);
    dVar9 = dVar9 * dVar4;
    *pdVar1 = dVar9 * dVar9 * 0.25 * dVar8 + dVar5 * dVar4 * dVar7 * 0.25;
    dVar5 = (this->super_payoff).K_;
    pdVar1 = matrix::operator()(__return_storage_ptr__,iVar2,0);
    dVar5 = dVar5 - dVar4;
    if (dVar5 <= 0.0) {
      dVar5 = 0.0;
    }
    *pdVar1 = dVar5;
  }
  dVar5 = (this->super_payoff).r_;
  dVar9 = (this->super_payoff).sigma_;
  pdVar1 = matrix::operator()(&A,m,m + -1);
  dVar3 = dVar3 * (double)m;
  dVar9 = dVar9 * dVar3;
  *pdVar1 = dVar5 * 0.25 * dVar3 * dVar7 + dVar9 * dVar9 * -0.25 * dVar8;
  dVar5 = (this->super_payoff).r_;
  dVar9 = (this->super_payoff).sigma_;
  pdVar1 = matrix::operator()(&A,m,m);
  dVar9 = dVar9 * dVar3;
  *pdVar1 = dVar5 * dVar6 * 0.5 + dVar9 * dVar9 * dVar8 * 0.5 + 1.0;
  dVar5 = (this->super_payoff).r_;
  dVar9 = (this->super_payoff).sigma_;
  pdVar1 = matrix::operator()(&B,m,m + -1);
  dVar9 = dVar9 * dVar3;
  *pdVar1 = dVar5 * -0.25 * dVar3 * dVar7 + dVar9 * dVar9 * 0.25 * dVar8;
  dVar5 = (this->super_payoff).r_;
  dVar7 = (this->super_payoff).sigma_;
  pdVar1 = matrix::operator()(&B,m,m);
  dVar7 = dVar7 * dVar3;
  *pdVar1 = (1.0 - dVar8 * dVar7 * dVar7 * 0.5) - dVar5 * dVar6 * 0.5;
  dVar5 = (this->super_payoff).K_;
  pdVar1 = matrix::operator()(__return_storage_ptr__,m,0);
  dVar5 = dVar5 - dVar3;
  if (dVar5 <= 0.0) {
    dVar5 = 0.0;
  }
  *pdVar1 = dVar5;
  inverse(&local_80,&A);
  matrix::operator=(&C,&local_80);
  matrix::~matrix(&local_80);
  mul(&local_80,&C,&B);
  matrix::operator=(&C,&local_80);
  matrix::~matrix(&local_80);
  if (n < 1) {
    n = 0;
  }
  for (iVar2 = 1; iVar2 - n != 1; iVar2 = iVar2 + 1) {
    mul(&local_80,&C,__return_storage_ptr__);
    matrix::operator=(__return_storage_ptr__,&local_80);
    matrix::~matrix(&local_80);
    pdVar1 = matrix::operator()(__return_storage_ptr__,m,0);
    *pdVar1 = 0.0;
    dVar5 = (this->super_payoff).K_;
    dVar7 = exp(((this->super_payoff).T_ - (double)iVar2 * dVar6) * -(this->super_payoff).r_);
    local_f8 = 0.0;
    if (0.0 < dVar7 * dVar5 + -dVar3) {
      dVar5 = (this->super_payoff).K_;
      dVar7 = exp((-(double)iVar2 * dVar6 + (this->super_payoff).T_) * -(this->super_payoff).r_);
      local_f8 = dVar7 * dVar5 + -dVar3;
    }
    pdVar1 = matrix::operator()(__return_storage_ptr__,0,0);
    *pdVar1 = local_f8;
  }
  matrix::~matrix(&C);
  matrix::~matrix(&B);
  matrix::~matrix(&A);
  return __return_storage_ptr__;
}

Assistant:

matrix put::option_Crank_Nicolson(int m, int n){
    double s;
    double h  = L_/m;
    double dt = T_/n;
    double lambda, nu;
    int i, k;
    lambda = dt/h;
    nu = dt/(h*h);

    matrix A(m + 1, m + 1);
    matrix B(m + 1, m + 1);
    matrix C(m + 1, m + 1);
    matrix P(m + 1, 1);

    P(0, 0) = K_;//price
    A(0, 0) = 1 + r_*dt/2;
    B(0, 0) = 1 - r_*dt/2;
    for(i = 1; i < m; i++){
        s = i * h;
        A(i, i-1) = 0.25*r_*s*lambda - 0.25*pow(sigma_*s, 2)*nu;
        A(i, i) = 1+pow(sigma_*s, 2)*nu*0.5 + r_*dt*05;
        A(i, i+1) = 0.25*-r_*s*lambda - 0.25*pow(sigma_*s, 2)*nu;
        B(i, i-1) = 0.25*-r_*s*lambda + 0.25*pow(sigma_*s, 2)*nu;
        B(i, i) = 1-pow(sigma_*s, 2)*nu*0.5 - r_*dt*05;
        B(i, i+1) = r_*s*lambda/4 + 0.25*pow(sigma_*s, 2)*nu;
        P(i, 0) = ((K_-s > 0) ? (K_-s) : 0);
    }


    s = m*h;
    A(m, m-1) = 0.25*r_*s*lambda-0.25*pow(sigma_*s, 2)*nu;
    A(m, m) = 1+pow(sigma_*s, 2)*nu*0.5+r_*dt*0.5;
    B(m, m-1) = 0.25*-r_*s*lambda+0.25*pow(sigma_*s, 2)*nu;
    B(m, m) = 1-pow(sigma_*s, 2)*nu*0.5-r_*dt*0.5;
    P(m, 0) = ((K_-s > 0) ? (K_-s) : 0);

    C = inverse(A);//operator=
    C = mul(C, B);

    for(k = 1; k <= n; k++){
        P = mul(C, P);
        P(m, 0) = 0;
        P(0, 0) = ((K_*exp(-r_*(T_-k*dt))-s > 0) ? (K_*exp(-r_*(T_-k*dt))-s) : 0);
    }
    return P;
}